

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdlib.cpp
# Opt level: O2

FString ExtractFilePath(char *path)

{
  size_t sVar1;
  long lVar2;
  size_t sVar3;
  char *pcVar4;
  char *in_RSI;
  
  sVar3 = strlen(in_RSI);
  do {
    pcVar4 = in_RSI;
    if (sVar3 == 1) goto LAB_00378104;
    sVar1 = sVar3 - 1;
    lVar2 = sVar3 - 2;
    sVar3 = sVar1;
  } while (in_RSI[lVar2] != '/');
  pcVar4 = in_RSI + sVar1;
LAB_00378104:
  FString::FString((FString *)path,in_RSI,(long)pcVar4 - (long)in_RSI);
  return (FString)path;
}

Assistant:

FString ExtractFilePath (const char *path)
{
	const char *src;

	src = path + strlen(path) - 1;

//
// back up until a \ or the start
//
	while (src != path && !IsSeperator(*(src-1)))
		src--;

	return FString(path, src - path);
}